

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  ImVec2 IVar1;
  ImDrawList *pIVar2;
  ImGuiWindow *this;
  ImFont *font;
  char *text;
  undefined1 auVar3 [16];
  float fVar4;
  ImGuiContext *pIVar5;
  ImRect *r;
  ImGuiWindow *pIVar6;
  ImU32 IVar7;
  ImGuiWindow **ppIVar8;
  char *text_end;
  int i;
  int i_00;
  ImVector<ImGuiWindow_*> *this_00;
  uint idx;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  ImRect IVar12;
  ImRect local_a8;
  float local_94;
  ImRect *local_90;
  ImGuiContext *local_88;
  ImRect local_80;
  ImVec2 *local_70;
  ImDrawList *local_68;
  ImGuiWindow *local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar5 = GImGui;
  local_60 = GImGui->CurrentWindow;
  local_48 = (bb->Min).x;
  fStack_44 = (bb->Min).y;
  auVar11._0_4_ = (bb->Max).x - local_48;
  auVar11._4_4_ = (bb->Max).y - fStack_44;
  auVar11._8_8_ = 0;
  IVar1 = (viewport->super_ImGuiViewport).Pos;
  auVar3._8_8_ = 0;
  auVar3._0_4_ = (viewport->super_ImGuiViewport).Size.x;
  auVar3._4_4_ = (viewport->super_ImGuiViewport).Size.y;
  local_58 = divps(auVar11,auVar3);
  local_48 = local_48 - IVar1.x * local_58._0_4_;
  fStack_44 = fStack_44 - IVar1.y * local_58._4_4_;
  fStack_40 = 0.0 - local_58._8_4_ * 0.0;
  fStack_3c = 0.0 - local_58._12_4_ * 0.0;
  pIVar2 = local_60->DrawList;
  local_68 = draw_list;
  IVar7 = GetColorU32(5,0.4);
  local_90 = bb;
  local_70 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar2,&bb->Min,&bb->Max,IVar7,0.0,0);
  local_88 = pIVar5;
  this_00 = &pIVar5->Windows;
  for (i_00 = 0; i_00 != this_00->Size; i_00 = i_00 + 1) {
    ppIVar8 = ImVector<ImGuiWindow_*>::operator[](this_00,i_00);
    this = *ppIVar8;
    if ((this->WasActive == true) && ((this->Flags & 0x1000000) == 0)) {
      local_a8 = ImGuiWindow::Rect(this);
      IVar12 = ImGuiWindow::TitleBarRect(this);
      r = local_90;
      fVar9 = local_a8.Min.x;
      fVar10 = local_a8.Max.x;
      fVar4 = local_a8.Max.y;
      local_a8.Min.y = (float)(int)(local_a8.Min.y * (float)local_58._4_4_ + fStack_44);
      local_a8.Min.x = (float)(int)(fVar9 * (float)local_58._0_4_ + local_48);
      local_a8.Max.x = (float)(int)(fVar10 * (float)local_58._0_4_ + local_48);
      local_a8.Max.y = (float)(int)(fVar4 * (float)local_58._4_4_ + fStack_44);
      local_80.Min.x = (float)(int)(IVar12.Min.x * (float)local_58._0_4_ + local_48);
      local_80.Min.y = (float)(int)(IVar12.Min.y * (float)local_58._4_4_ + fStack_44);
      local_80.Max.x = (float)(int)(IVar12.Max.x * (float)local_58._0_4_ + local_48);
      local_80.Max.y = local_80.Min.y + 5.0;
      ImRect::ClipWithFull(&local_a8,local_90);
      ImRect::ClipWithFull(&local_80,r);
      pIVar6 = local_60;
      idx = 10;
      if (local_88->NavWindow != (ImGuiWindow *)0x0) {
        idx = this->RootWindowForTitleBarHighlight ==
              local_88->NavWindow->RootWindowForTitleBarHighlight | 10;
      }
      pIVar2 = local_60->DrawList;
      IVar7 = GetColorU32(2,1.0);
      ImDrawList::AddRectFilled(pIVar2,&local_a8.Min,&local_a8.Max,IVar7,0.0,0);
      pIVar2 = pIVar6->DrawList;
      IVar7 = GetColorU32(idx,1.0);
      ImDrawList::AddRectFilled(pIVar2,&local_80.Min,&local_80.Max,IVar7,0.0,0);
      pIVar2 = pIVar6->DrawList;
      IVar7 = GetColorU32(5,1.0);
      ImDrawList::AddRect(pIVar2,&local_a8.Min,&local_a8.Max,IVar7,0.0,0,1.0);
      pIVar2 = pIVar6->DrawList;
      font = local_88->Font;
      local_94 = local_88->FontSize;
      IVar7 = GetColorU32(0,1.0);
      text = this->Name;
      text_end = FindRenderedTextEnd(text,(char *)0x0);
      ImDrawList::AddText(pIVar2,font,local_94,&local_80.Min,IVar7,text,text_end,0.0,(ImVec4 *)0x0);
    }
  }
  IVar7 = GetColorU32(5,1.0);
  ImDrawList::AddRect(local_68,&local_90->Min,local_70,IVar7,0.0,0,1.0);
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}